

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O2

ares_status_t
ares_process_fds_nolock(ares_channel_t *channel,ares_fd_events_t *events,size_t nevents,uint flags)

{
  uint uVar1;
  ares_channel_t *paVar2;
  ares_htable_szvp_t *htable;
  ares_dns_record_t *paVar3;
  char cVar4;
  unsigned_short uVar5;
  ares_status_t aVar6;
  ares_status_t aVar7;
  ares_conn_err_t aVar8;
  ares_status_t aVar9;
  ares_bool_t aVar10;
  ares_dns_rcode_t aVar11;
  ares_dns_rec_type_t aVar12;
  ares_conn_t *paVar13;
  size_t sVar14;
  uchar *puVar15;
  ares_dns_rr_t *paVar16;
  ares_dns_rr_t *paVar17;
  ares_dns_record_t *paVar18;
  ares_slist_node_t *paVar19;
  ares_query_t *paVar20;
  ares_server_t *paVar21;
  size_t sVar22;
  ares_buf_t *buf;
  ulong idx;
  size_t sVar23;
  unsigned_short dns_len;
  ares_dns_record_t *local_c8;
  ares_query_t *local_c0;
  ares_dns_record_t *local_b8;
  char *aname;
  ares_channel_t *local_a8;
  size_t local_a0;
  ares_array_t *requeue;
  size_t count;
  ares_server_t *local_88;
  ares_server_t *local_80;
  ares_channel_t *local_78;
  size_t data_len;
  uint local_64;
  ares_dns_class_t local_60;
  ares_dns_class_t qclass;
  ares_dns_rec_type_t atype;
  ares_dns_rec_type_t qtype;
  size_t local_50;
  ares_timeval_t now;
  
  if (events == (ares_fd_events_t *)0x0 && nevents != 0) {
    aVar7 = ARES_EFORMERR;
  }
  else {
    local_a0 = nevents;
    local_78 = channel;
    local_64 = flags;
    ares_tvnow(&now);
    aVar7 = ARES_SUCCESS;
    sVar14 = local_a0;
    for (sVar23 = 0; sVar14 != sVar23; sVar23 = sVar23 + 1) {
      if ((events[sVar23].fd != -1) && ((events[sVar23].events & 2) != 0)) {
        paVar13 = ares_conn_from_fd(local_78,events[sVar23].fd);
        aVar7 = ARES_SUCCESS;
        sVar14 = local_a0;
        if (paVar13 != (ares_conn_t *)0x0) {
          if ((paVar13->flags & ARES_CONN_FLAG_TFO_INITIAL) == ARES_CONN_FLAG_NONE) {
            *(undefined1 *)&paVar13->state_flags =
                 (char)paVar13->state_flags | ARES_CONN_STATE_CONNECTED;
          }
          aVar6 = ares_conn_flush(paVar13);
          sVar14 = local_a0;
          if ((aVar6 != ARES_SUCCESS) &&
             (handle_conn_error(paVar13,ARES_TRUE,aVar6), sVar14 = local_a0, aVar7 = aVar6,
             aVar6 == ARES_ENOMEM)) goto LAB_00113655;
        }
      }
    }
    for (sVar23 = 0; sVar23 != sVar14; sVar23 = sVar23 + 1) {
      if ((events[sVar23].fd != -1) && ((events[sVar23].events & 1) != 0)) {
        paVar13 = ares_conn_from_fd(local_78,events[sVar23].fd);
        if (paVar13 == (ares_conn_t *)0x0) {
          aVar7 = ARES_SUCCESS;
          sVar14 = local_a0;
        }
        else {
          paVar2 = paVar13->server->channel;
          do {
            while( true ) {
              aname = (char *)0xffff;
              sVar14 = ares_buf_len(paVar13->in_buf);
              if ((((paVar13->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) &&
                  (aVar7 = ares_buf_append_be16(paVar13->in_buf,0), aVar7 != ARES_SUCCESS)) ||
                 (puVar15 = ares_buf_append_start(paVar13->in_buf,(size_t *)&aname),
                 puVar15 == (uchar *)0x0)) {
                ares_close_connection(paVar13,ARES_SUCCESS);
                goto LAB_00113655;
              }
              aVar8 = ares_conn_read(paVar13,puVar15,(size_t)aname,&count);
              if (aVar8 != ARES_CONN_ERR_SUCCESS) {
                ares_buf_append_finish(paVar13->in_buf,0);
                if ((paVar13->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) {
                  ares_buf_set_length(paVar13->in_buf,sVar14);
                }
                if (aVar8 != ARES_CONN_ERR_WOULDBLOCK) {
                  aVar7 = ARES_ECONNREFUSED;
                  handle_conn_error(paVar13,ARES_TRUE,ARES_ECONNREFUSED);
                  sVar14 = local_a0;
                  goto LAB_00113643;
                }
                goto LAB_001130a9;
              }
              ares_buf_append_finish(paVar13->in_buf,count);
              uVar1 = (paVar2->sock_funcs).flags;
              if ((uVar1 & 1) != 0) break;
              if ((paVar13->flags & ARES_CONN_FLAG_TCP) != ARES_CONN_FLAG_NONE) goto LAB_001130a9;
LAB_00113023:
              aname = (char *)ares_buf_len(paVar13->in_buf);
              ares_buf_set_length(paVar13->in_buf,sVar14);
              ares_buf_append_be16(paVar13->in_buf,(unsigned_short)count);
              ares_buf_set_length(paVar13->in_buf,(size_t)aname);
              if ((uVar1 & 1) == 0) goto LAB_001130a9;
            }
            if ((paVar13->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) goto LAB_00113023;
          } while ((char *)count == aname);
LAB_001130a9:
          local_a8 = paVar13->server->channel;
          requeue = (ares_array_t *)0x0;
          local_50 = sVar23;
          while( true ) {
            dns_len = 0;
            data_len = 0;
            ares_buf_tag(paVar13->in_buf);
            aVar7 = ares_buf_fetch_be16(paVar13->in_buf,&dns_len);
            buf = paVar13->in_buf;
            if (aVar7 != ARES_SUCCESS) break;
            aVar7 = ares_buf_consume(buf,(ulong)dns_len);
            buf = paVar13->in_buf;
            if (aVar7 != ARES_SUCCESS) break;
            puVar15 = ares_buf_tag_fetch(buf,&data_len);
            if ((puVar15 == (uchar *)0x0) || (data_len < 2)) {
              ares_buf_tag_clear(paVar13->in_buf);
              aVar7 = ARES_SUCCESS;
              goto LAB_001135c9;
            }
            sVar14 = data_len - 2;
            paVar21 = paVar13->server;
            local_c8 = (ares_dns_record_t *)0x0;
            sVar22 = data_len - 2;
            data_len = sVar14;
            if (sVar22 != 0) {
              aVar6 = ares_dns_parse(puVar15 + 2,sVar22,0,&local_c8);
              aVar7 = ARES_EBADRESP;
              if (aVar6 == ARES_SUCCESS) {
                htable = local_a8->queries_by_qid;
                uVar5 = ares_dns_record_get_id(local_c8);
                paVar20 = (ares_query_t *)ares_htable_szvp_get_direct(htable,(ulong)uVar5);
                paVar18 = local_c8;
                aVar6 = ARES_SUCCESS;
                aVar7 = aVar6;
                if (paVar20 != (ares_query_t *)0x0) {
                  paVar2 = paVar20->channel;
                  paVar3 = paVar20->query;
                  local_c0 = paVar20;
                  local_80 = paVar21;
                  sVar14 = ares_dns_record_query_cnt(paVar3);
                  local_b8 = paVar18;
                  sVar22 = ares_dns_record_query_cnt(paVar18);
                  sVar23 = local_50;
                  aVar7 = ARES_SUCCESS;
                  if (sVar14 == sVar22) {
                    for (idx = 0; sVar14 = ares_dns_record_query_cnt(paVar3), paVar20 = local_c0,
                        idx < sVar14; idx = idx + 1) {
                      count = 0;
                      aname = (char *)0x0;
                      aVar9 = ares_dns_record_query_get(paVar3,idx,(char **)&count,&qtype,&qclass);
                      aVar7 = aVar6;
                      if (((aVar9 != ARES_SUCCESS) || (count == 0)) ||
                         ((aVar9 = ares_dns_record_query_get(local_b8,idx,&aname,&atype,&local_60),
                          aVar9 != ARES_SUCCESS ||
                          (((aname == (char *)0x0 || (qtype != atype)) || (qclass != local_60))))))
                      goto LAB_00113164;
                      if (((paVar2->flags & 0x400) == 0) || (local_c0->using_tcp != ARES_FALSE)) {
                        aVar10 = ares_strcaseeq((char *)count,aname);
                      }
                      else {
                        aVar10 = ares_streq((char *)count,aname);
                      }
                      if (aVar10 == ARES_FALSE) goto LAB_00113164;
                    }
                    aVar9 = ares_cookie_validate(local_c0,local_c8,paVar13,&now,&requeue);
                    aVar7 = aVar6;
                    if (aVar9 == ARES_SUCCESS) {
                      ares_llist_node_destroy(paVar20->node_queries_to_conn);
                      paVar3 = local_c8;
                      paVar20->node_queries_to_conn = (ares_llist_node_t *)0x0;
                      paVar18 = paVar20->query;
                      aVar11 = ares_dns_record_get_rcode(local_c8);
                      if (((aVar11 == ARES_RCODE_FORMERR) &&
                          (paVar16 = ares_dns_get_opt_rr_const(paVar18),
                          paVar16 != (ares_dns_rr_t *)0x0)) &&
                         ((paVar17 = ares_dns_get_opt_rr_const(paVar3),
                          paVar17 == (ares_dns_rr_t *)0x0 ||
                          ((sVar14 = ares_dns_rr_get_opt_cnt(paVar16,ARES_RR_OPT_OPTIONS),
                           sVar14 != 0 &&
                           (paVar16 = ares_dns_get_opt_rr_const(paVar3),
                           paVar16 != (ares_dns_rr_t *)0x0)))))) {
                        local_b8 = (ares_dns_record_t *)0x0;
                        while (paVar20 = local_c0,
                              paVar18 = (ares_dns_record_t *)
                                        ares_dns_record_rr_cnt
                                                  (local_c0->query,ARES_SECTION_ADDITIONAL),
                              local_b8 < paVar18) {
                          paVar16 = ares_dns_record_rr_get
                                              (paVar20->query,ARES_SECTION_ADDITIONAL,
                                               (size_t)local_b8);
                          aVar12 = ares_dns_rr_get_type(paVar16);
                          paVar20 = local_c0;
                          if (aVar12 == ARES_REC_TYPE_OPT) {
                            ares_dns_record_rr_del
                                      (local_c0->query,ARES_SECTION_ADDITIONAL,(size_t)local_b8);
                            paVar21 = local_80;
                            goto LAB_00113543;
                          }
                          local_b8 = (ares_dns_record_t *)((long)&local_b8->id + 1);
                        }
                        end_query(local_a8,local_80,paVar20,ARES_EFORMERR,(ares_dns_record_t *)0x0);
                        aVar7 = ARES_EFORMERR;
                      }
                      else {
                        uVar5 = ares_dns_record_get_flags(local_c8);
                        paVar21 = local_80;
                        if ((uVar5 & 4) == 0) {
                          cVar4 = (char)local_a8->flags;
                        }
                        else {
                          cVar4 = (char)local_a8->flags;
                          if ((local_a8->flags & 4) == 0 &&
                              (paVar13->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) {
                            local_c0->using_tcp = ARES_TRUE;
                            paVar21 = (ares_server_t *)0x0;
                            paVar20 = local_c0;
LAB_00113543:
                            aVar7 = ares_append_requeue(&requeue,paVar20,paVar21);
                            goto LAB_00113164;
                          }
                        }
                        if (cVar4 < '\0') {
LAB_00113457:
                          paVar20 = local_c0;
                          aVar7 = ares_qcache_insert(local_a8,&now,local_c0,local_c8);
                          local_b8 = (ares_dns_record_t *)CONCAT44(local_b8._4_4_,aVar7);
                          aVar10 = paVar20->using_tcp;
                          paVar19 = ares_slist_node_find(paVar21->channel->servers,paVar21);
                          if (paVar19 != (ares_slist_node_t *)0x0) {
                            if (paVar21->consec_failures != 0) {
                              paVar21->consec_failures = 0;
                              ares_slist_node_reinsert(paVar19);
                            }
                            (paVar21->next_retry_time).sec = 0;
                            (paVar21->next_retry_time).usec = 0;
                            invoke_server_state_cb(paVar21,ARES_TRUE,(aVar10 == ARES_TRUE) + 1);
                          }
                          end_query(local_a8,paVar21,local_c0,ARES_SUCCESS,local_c8);
                          aVar7 = ARES_SUCCESS;
                          if ((int)local_b8 == 0) goto LAB_00113176;
                        }
                        else {
                          aVar11 = ares_dns_record_get_rcode(local_c8);
                          paVar20 = local_c0;
                          aVar7 = ARES_ESERVFAIL;
                          if (aVar11 != ARES_RCODE_SERVFAIL) {
                            if (aVar11 == ARES_RCODE_REFUSED) {
                              aVar7 = ARES_EREFUSED;
                            }
                            else {
                              if (aVar11 != ARES_RCODE_NOTIMP) goto LAB_00113457;
                              aVar7 = ARES_ENOTIMP;
                            }
                          }
                          server_increment_failures(paVar21,local_c0->using_tcp);
                          aVar7 = ares_requeue_query(paVar20,&now,aVar7,ARES_TRUE,local_c8,&requeue)
                          ;
                          if (aVar7 != ARES_ENOMEM) {
                            aVar7 = ARES_SUCCESS;
                          }
                        }
                      }
                    }
                  }
                }
              }
LAB_00113164:
              ares_dns_record_destroy(local_c8);
              if (aVar7 != ARES_SUCCESS) {
                handle_conn_error(paVar13,ARES_TRUE,aVar7);
                goto LAB_001135c9;
              }
            }
LAB_00113176:
            ares_buf_tag_clear(paVar13->in_buf);
          }
          ares_buf_tag_rollback(buf);
LAB_001135c9:
          paVar2 = local_a8;
          while ((sVar14 = ares_array_len(requeue), sVar14 != 0 &&
                 (aVar6 = ares_array_claim_at(&count,0x10,requeue,0), aVar6 == ARES_SUCCESS))) {
            paVar20 = (ares_query_t *)
                      ares_htable_szvp_get_direct(paVar2->queries_by_qid,count & 0xffff);
            if ((paVar20 != (ares_query_t *)0x0) &&
               (aVar6 = ares_send_query(local_88,paVar20,&now), aVar6 == ARES_ENOMEM)) {
              aVar7 = ARES_ENOMEM;
            }
          }
          ares_array_destroy(requeue);
          sVar14 = local_a0;
          if (aVar7 == ARES_ENOMEM) goto LAB_00113655;
        }
      }
LAB_00113643:
    }
    if ((local_64 & 1) == 0) {
      ares_check_cleanup_conns(local_78);
      do {
        paVar19 = ares_slist_node_first(local_78->queries_by_timeout);
        if (paVar19 == (ares_slist_node_t *)0x0) {
          return ARES_SUCCESS;
        }
        paVar20 = (ares_query_t *)ares_slist_node_val(paVar19);
        aVar10 = ares_timedout(&now,&paVar20->timeout);
        if (aVar10 == ARES_FALSE) {
          return ARES_SUCCESS;
        }
        paVar20->timeouts = paVar20->timeouts + 1;
        server_increment_failures(paVar20->conn->server,paVar20->using_tcp);
        aVar7 = ares_requeue_query(paVar20,&now,ARES_ETIMEOUT,ARES_TRUE,(ares_dns_record_t *)0x0,
                                   (ares_array_t **)0x0);
      } while (aVar7 != ARES_ENOMEM);
    }
    else if (aVar7 != ARES_ENOMEM) {
      return ARES_SUCCESS;
    }
LAB_00113655:
    aVar7 = ARES_ENOMEM;
  }
  return aVar7;
}

Assistant:

static ares_status_t ares_process_fds_nolock(ares_channel_t         *channel,
                                             const ares_fd_events_t *events,
                                             size_t nevents, unsigned int flags)
{
  ares_timeval_t now;
  size_t         i;
  ares_status_t  status = ARES_SUCCESS;

  if (channel == NULL || (events == NULL && nevents != 0)) {
    return ARES_EFORMERR; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  ares_tvnow(&now);

  /* Process write events */
  for (i = 0; i < nevents; i++) {
    if (events[i].fd == ARES_SOCKET_BAD ||
        !(events[i].events & ARES_FD_EVENT_WRITE)) {
      continue;
    }
    status = process_write(channel, events[i].fd);
    /* We only care about ENOMEM, anything else is handled via connection
     * retries, etc */
    if (status == ARES_ENOMEM) {
      goto done;
    }
  }

  /* Process read events */
  for (i = 0; i < nevents; i++) {
    if (events[i].fd == ARES_SOCKET_BAD ||
        !(events[i].events & ARES_FD_EVENT_READ)) {
      continue;
    }
    status = process_read(channel, events[i].fd, &now);
    if (status == ARES_ENOMEM) {
      goto done;
    }
  }

  if (!(flags & ARES_PROCESS_FLAG_SKIP_NON_FD)) {
    ares_check_cleanup_conns(channel);
    status = process_timeouts(channel, &now);
    if (status == ARES_ENOMEM) {
      goto done;
    }
  }

done:
  if (status == ARES_ENOMEM) {
    return ARES_ENOMEM;
  }
  return ARES_SUCCESS;
}